

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O1

void sf2cute::RIFF::WriteHeader(ostream *out,string *name,size_type size)

{
  long lVar1;
  length_error *this;
  
  if (size >> 0x20 == 0) {
    lVar1 = *(long *)(*(long *)out + -0x18);
    *(undefined4 *)(out + lVar1 + 0x1c) = 5;
    std::ios::clear((int)out + (int)lVar1);
    std::ostream::write((char *)out,0x115489);
    InsertInt32L<std::ostream>(out,(uint32_t)size);
    std::ostream::write((char *)out,(long)(name->_M_dataplus)._M_p);
    return;
  }
  this = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this,"RIFF file size too large.");
  __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void RIFF::WriteHeader(std::ostream & out,
    const std::string & name,
    size_type size) {
  // Throw exception if the RIFF file size exceeds the maximum.
  if (size > UINT32_MAX) {
    throw std::length_error("RIFF file size too large.");
  }

  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the ID "RIFF".
    out.write("RIFF", 4);

    // Write the file size.
    InsertInt32L(out, static_cast<uint32_t>(size));

    // Write the form type.
    out.write(name.data(), name.size());
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}